

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadJSONFile
          (cmCMakePresetsGraph *this,string *filename,RootType rootType,ReadReason readReason,
          vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          *inProgressFiles,File **file,string *errMsg)

{
  string *psVar1;
  pointer *pppFVar2;
  pointer puVar3;
  pointer pcVar4;
  bool bVar5;
  byte bVar6;
  ReadFileResult RVar7;
  ReadFileResult RVar8;
  uint uVar9;
  uint uVar10;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  _Var11;
  Value *__args_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  pointer pbVar12;
  TestPreset *pTVar13;
  pointer puVar14;
  BuildPreset *pBVar15;
  pointer pBVar16;
  pointer pTVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_bool>
  pVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_bool>
  pVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_bool>
  pVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_bool>
  pVar21;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_bool>
  pVar22;
  int v;
  BuildPreset *local_ee8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
  *local_ee0;
  TestPreset *local_ed8;
  pointer local_ed0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ec8;
  RootType local_ebc;
  __single_object filePtr;
  Value root;
  string directory;
  RootPresets presets;
  anon_class_24_3_d2e26b0a includeFile;
  CharReaderBuilder builder;
  string local_d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  Members extraFields;
  _Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> local_b48;
  PresetPair<cmCMakePresetsGraph::BuildPreset> presetPair_1;
  _Optional_payload_base<cmCMakePresetsGraph::TestPreset> local_5c8;
  ifstream fin;
  byte abStack_218 [488];
  
  puVar3 = (this->Files).
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_ed0 = (pointer)file;
  local_ebc = rootType;
  for (puVar14 = (this->Files).
                 super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar3; puVar14 = puVar14 + 1
      ) {
    bVar5 = cmsys::SystemTools::SameFile
                      (filename,&((puVar14->_M_t).
                                  super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
                                  .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>.
                                 _M_head_impl)->Filename);
    if (bVar5) {
      (local_ed0->_M_dataplus)._M_p =
           (pointer)(puVar14->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>._M_head_impl;
      _Var11 = std::
               __find_if<__gnu_cxx::__normal_iterator<cmCMakePresetsGraph::File**,std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmCMakePresetsGraph::File*const>>
                         ((inProgressFiles->
                          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (inProgressFiles->
                          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
      if (_Var11._M_current !=
          (inProgressFiles->
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return CYCLIC_INCLUDE;
      }
      return READ_OK;
    }
  }
  std::ifstream::ifstream(&fin,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0) {
    presetPair_1.Unexpanded.super_Preset.Name._M_dataplus._M_p = (filename->_M_dataplus)._M_p;
    presetPair_1.Unexpanded.super_Preset._vptr_Preset = (_func_int **)filename->_M_string_length;
    extraFields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16;
    extraFields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_5065ca;
    cmStrCat<std::__cxx11::string>
              ((string *)&presets,(cmAlphaNum *)&presetPair_1,(cmAlphaNum *)&extraFields,errMsg);
    std::__cxx11::string::operator=((string *)errMsg,(string *)&presets);
    std::__cxx11::string::~string((string *)&presets);
    RVar8 = FILE_NOT_FOUND;
    goto LAB_001eeabf;
  }
  cmsys::FStream::ReadBOM((istream *)&fin);
  Json::Value::Value(&root,nullValue);
  Json::CharReaderBuilder::CharReaderBuilder(&builder);
  Json::CharReaderBuilder::strictMode(&builder.settings_);
  bVar5 = Json::parseFromStream(&builder.super_Factory,(IStream *)&fin,&root,errMsg);
  if (bVar5) {
    v = 0;
    RVar7 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::operator()
                      ((Object<int> *)(anonymous_namespace)::RootVersionHelper,&v,&root);
    RVar8 = RVar7;
    if (RVar7 != READ_OK) goto LAB_001eeaa8;
    if (v - 7U < 0xfffffffa) {
      RVar8 = UNRECOGNIZED_VERSION;
      goto LAB_001eeaa8;
    }
    if ((uint)v < 2) {
      bVar5 = Json::Value::isMember(&root,"buildPresets");
      RVar7 = BUILD_TEST_PRESETS_UNSUPPORTED;
      RVar8 = BUILD_TEST_PRESETS_UNSUPPORTED;
      if ((bVar5) ||
         (bVar5 = Json::Value::isMember(&root,"testPresets"), RVar8 = BUILD_TEST_PRESETS_UNSUPPORTED
         , bVar5)) goto LAB_001eeaa8;
    }
    if (v < 6) {
      bVar5 = Json::Value::isMember(&root,"packagePresets");
      if (bVar5) {
        RVar8 = PACKAGE_PRESETS_UNSUPPORTED;
      }
      else {
        if (5 < v) goto LAB_001eeb7d;
        bVar5 = Json::Value::isMember(&root,"workflowPresets");
        if (bVar5) {
          RVar8 = WORKFLOW_PRESETS_UNSUPPORTED;
        }
        else {
          if ((3 < v) || (bVar5 = Json::Value::isMember(&root,"include"), !bVar5))
          goto LAB_001eeb7d;
          RVar8 = INCLUDE_UNSUPPORTED;
        }
      }
      goto LAB_001eeaa8;
    }
LAB_001eeb7d:
    presets.CMakeMinimumRequired.Major = 0;
    presets.CMakeMinimumRequired.Minor = 0;
    presets.CMakeMinimumRequired.Patch = 0;
    memset(&presets.ConfigurePresets,0,0x90);
    bVar5 = Json::Value::isObject(&root);
    RVar8 = DAT_00867fa8;
    if (bVar5) {
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Json::Value::getMemberNames_abi_cxx11_((Members *)&presetPair_1,&root);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&extraFields,&presetPair_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&presetPair_1);
      local_ee8 = DAT_00867f90;
      pBVar15 = (anonymous_namespace)::RootPresetsHelper;
      do {
        if (pBVar15 == local_ee8) {
          RVar7 = (&DAT_00867fa4)
                  [extraFields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   extraFields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish & ~DAT_00867fac];
          break;
        }
        pcVar4 = (pBVar15->super_Preset).Name._M_dataplus._M_p;
        presetPair_1.Unexpanded.super_Preset._vptr_Preset =
             (_func_int **)&presetPair_1.Unexpanded.super_Preset.Name._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&presetPair_1,pcVar4,
                   pcVar4 + (long)(pBVar15->super_Preset)._vptr_Preset);
        bVar5 = Json::Value::isMember(&root,(String *)&presetPair_1);
        if (bVar5) {
          __args_1 = Json::Value::operator[](&root,(String *)&presetPair_1);
          RVar8 = std::
                  function<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::RootPresets_&,_const_Json::Value_*)>
                  ::operator()((function<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::RootPresets_&,_const_Json::Value_*)>
                                *)&(pBVar15->super_Preset).Name._M_string_length,&presets,__args_1);
          if (RVar8 == DAT_00867fa4) {
            __position = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   (extraFields.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    extraFields.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&presetPair_1);
            bVar5 = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(&extraFields,(const_iterator)__position._M_current);
          }
          else {
            bVar5 = false;
            RVar7 = RVar8;
          }
        }
        else if (*(char *)&(pBVar15->super_Preset).Inherits.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish == '\0') {
          RVar8 = std::
                  function<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::RootPresets_&,_const_Json::Value_*)>
                  ::operator()((function<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::RootPresets_&,_const_Json::Value_*)>
                                *)&(pBVar15->super_Preset).Name._M_string_length,&presets,
                               (Value *)0x0);
          bVar5 = RVar8 == DAT_00867fa4;
          if (!bVar5) {
            RVar7 = RVar8;
          }
        }
        else {
          bVar5 = false;
          RVar7 = DAT_00867fa8;
        }
        std::__cxx11::string::~string((string *)&presetPair_1);
        pBVar15 = (BuildPreset *)
                  &(pBVar15->super_Preset).Inherits.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (bVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&extraFields);
      RVar8 = RVar7;
    }
    if (RVar8 == READ_OK) {
      RVar7 = cmVersion::GetMajorVersion();
      uVar9 = cmVersion::GetMinorVersion();
      uVar10 = cmVersion::GetPatchVersion();
      RVar8 = UNRECOGNIZED_CMAKE_VERSION;
      if (presets.CMakeMinimumRequired.Major <= RVar7) {
        if (presets.CMakeMinimumRequired.Major == RVar7) {
          if ((uVar9 < presets.CMakeMinimumRequired.Minor) ||
             ((presets.CMakeMinimumRequired.Minor == uVar9 &&
              (RVar7 = UNRECOGNIZED_CMAKE_VERSION, uVar10 < presets.CMakeMinimumRequired.Patch))))
          goto LAB_001ef37b;
        }
        std::make_unique<cmCMakePresetsGraph::File>();
        pbVar12 = local_ed0;
        (local_ed0->_M_dataplus)._M_p =
             (pointer)filePtr._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
                    *)&this->Files,&filePtr);
        std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>::
        emplace_back<cmCMakePresetsGraph::File*&>
                  ((vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>> *)
                   inProgressFiles,(File **)pbVar12);
        std::__cxx11::string::_M_assign((string *)(pbVar12->_M_dataplus)._M_p);
        pcVar4 = (pbVar12->_M_dataplus)._M_p;
        *(int *)(pcVar4 + 0x20) = v;
        std::__detail::
        _Insert_base<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(pcVar4 + 0x28),(value_type *)pbVar12);
        local_ed8 = (TestPreset *)
                    presets.ConfigurePresets.
                    super__Vector_base<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        local_ee0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                     *)&this->ConfigurePresets;
        local_ec8 = &this->ConfigurePresetOrder;
        pTVar13 = (TestPreset *)
                  presets.ConfigurePresets.
                  super__Vector_base<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        RVar8 = RVar7;
        do {
          if (pTVar13 == local_ed8) {
            local_ee8 = presets.BuildPresets.
                        super__Vector_base<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            local_ed8 = (TestPreset *)&this->BuildPresets;
            local_ee0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                         *)&this->BuildPresetOrder;
            pBVar16 = presets.BuildPresets.
                      super__Vector_base<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_001eef55;
          }
          (pTVar13->super_Preset).OriginFile = (File *)(pbVar12->_M_dataplus)._M_p;
          if ((pTVar13->super_Preset).Name._M_string_length == 0) {
            RVar8 = INVALID_PRESET;
            std::__cxx11::string::append((char *)errMsg);
            std::__cxx11::string::append((string *)errMsg);
            break;
          }
          PresetPair<cmCMakePresetsGraph::ConfigurePreset>::PresetPair
                    ((PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)&extraFields);
          ConfigurePreset::operator=((ConfigurePreset *)&extraFields,(ConfigurePreset *)pTVar13);
          psVar1 = &(pTVar13->super_Preset).Name;
          std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset(&local_b48);
          local_ee8 = (BuildPreset *)psVar1;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                      *)&presetPair_1,psVar1,
                     (PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)&extraFields);
          pVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                   ::
                   _M_emplace_unique<std::pair<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>
                             (local_ee0,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                               *)&presetPair_1);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                   *)&presetPair_1);
          if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            RVar8 = DUPLICATE_PRESETS;
LAB_001eeece:
            bVar5 = false;
          }
          else {
            if (v < 3) {
              if (*(long *)((long)&(pTVar13->Output).
                                   super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                   ._M_payload + 0x58) == 0) {
                if ((pTVar13->super_Preset).ConditionEvaluator.
                    super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  if (*(long *)&(pTVar13->Output).
                                super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                ._M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                .
                                super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                ._M_payload._M_value.OutputLogFile._M_dataplus == 0)
                  goto LAB_001eeee9;
                  RVar8 = TOOLCHAIN_FILE_UNSUPPORTED;
                }
                else {
                  RVar8 = CONDITION_UNSUPPORTED;
                }
              }
              else {
                RVar8 = INSTALL_PREFIX_UNSUPPORTED;
              }
              goto LAB_001eeece;
            }
LAB_001eeee9:
            bVar5 = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_ec8,(value_type *)local_ee8);
          }
          PresetPair<cmCMakePresetsGraph::ConfigurePreset>::~PresetPair
                    ((PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)&extraFields);
          pTVar13 = (TestPreset *)
                    ((long)&(pTVar13->Filter).
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Include + 0x30);
          pbVar12 = local_ed0;
        } while (bVar5);
        goto LAB_001ef371;
      }
    }
    goto LAB_001ef37b;
  }
  presetPair_1.Unexpanded.super_Preset.Name._M_dataplus._M_p = (filename->_M_dataplus)._M_p;
  presetPair_1.Unexpanded.super_Preset._vptr_Preset = (_func_int **)filename->_M_string_length;
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x62a5c6;
  cmStrCat<std::__cxx11::string>
            ((string *)&presets,(cmAlphaNum *)&presetPair_1,(cmAlphaNum *)&extraFields,errMsg);
  std::__cxx11::string::operator=((string *)errMsg,(string *)&presets);
  std::__cxx11::string::~string((string *)&presets);
  RVar8 = JSON_PARSE_ERROR;
  goto LAB_001eeaa8;
  while( true ) {
    PresetPair<cmCMakePresetsGraph::BuildPreset>::PresetPair(&presetPair_1);
    BuildPreset::operator=(&presetPair_1.Unexpanded,pBVar16);
    psVar1 = &(pBVar16->super_Preset).Name;
    std::_Optional_payload_base<cmCMakePresetsGraph::BuildPreset>::_M_reset
              ((_Optional_payload_base<cmCMakePresetsGraph::BuildPreset> *)&presetPair_1.Expanded);
    pVar19 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
             ::
             _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
                         *)local_ed8,psVar1,&presetPair_1);
    if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      bVar5 = false;
      RVar8 = DUPLICATE_PRESETS;
    }
    else if ((v < 3) &&
            ((pBVar16->super_Preset).ConditionEvaluator.
             super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             != (element_type *)0x0)) {
      bVar5 = false;
      RVar8 = CONDITION_UNSUPPORTED;
    }
    else {
      bVar5 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_ee0,psVar1);
    }
    PresetPair<cmCMakePresetsGraph::BuildPreset>::~PresetPair(&presetPair_1);
    pBVar16 = pBVar16 + 1;
    pbVar12 = local_ed0;
    if (!bVar5) break;
LAB_001eef55:
    if (pBVar16 == local_ee8) {
      local_ed8 = presets.TestPresets.
                  super__Vector_base<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_ee0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                   *)&this->TestPresets;
      local_ec8 = &this->TestPresetOrder;
      pTVar17 = presets.TestPresets.
                super__Vector_base<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001ef079;
    }
    (pBVar16->super_Preset).OriginFile = (File *)(pbVar12->_M_dataplus)._M_p;
    if ((pBVar16->super_Preset).Name._M_string_length == 0) {
      std::__cxx11::string::append((char *)errMsg);
      std::__cxx11::string::append((string *)errMsg);
      RVar8 = INVALID_PRESET;
      break;
    }
  }
  goto LAB_001ef371;
LAB_001ef079:
  do {
    if (pTVar17 == local_ed8) {
      local_ed8 = (TestPreset *)
                  presets.PackagePresets.
                  super__Vector_base<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_ee0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                   *)&this->PackagePresets;
      local_ec8 = &this->PackagePresetOrder;
      pTVar13 = (TestPreset *)
                presets.PackagePresets.
                super__Vector_base<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001ef1ec;
    }
    (pTVar17->super_Preset).OriginFile = (File *)(pbVar12->_M_dataplus)._M_p;
    if ((pTVar17->super_Preset).Name._M_string_length == 0) goto LAB_001ef36e;
    PresetPair<cmCMakePresetsGraph::TestPreset>::PresetPair
              ((PresetPair<cmCMakePresetsGraph::TestPreset> *)&presetPair_1);
    TestPreset::operator=((TestPreset *)&presetPair_1,pTVar17);
    psVar1 = &(pTVar17->super_Preset).Name;
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset>::_M_reset(&local_5c8);
    local_ee8 = (BuildPreset *)psVar1;
    pVar20 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
             ::
             _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
                         *)local_ee0,psVar1,
                        (PresetPair<cmCMakePresetsGraph::TestPreset> *)&presetPair_1);
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      RVar8 = DUPLICATE_PRESETS;
LAB_001ef10b:
      bVar5 = false;
    }
    else {
      if (v < 3) {
        if ((pTVar17->super_Preset).ConditionEvaluator.
            super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) goto LAB_001ef113;
        RVar8 = CONDITION_UNSUPPORTED;
        goto LAB_001ef10b;
      }
      if ((uint)v < 5) {
LAB_001ef113:
        bVar6 = (pTVar17->Output).
                super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
                _M_payload.
                super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                _M_engaged;
        if (((bool)bVar6 != true) ||
           (*(char *)((long)&(pTVar17->Output).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                             ._M_payload + 0x70) == '\0')) goto LAB_001ef13f;
        RVar8 = TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
        goto LAB_001ef10b;
      }
      if (v == 5) {
        bVar6 = (pTVar17->Output).
                super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
                _M_payload.
                super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                _M_engaged;
LAB_001ef13f:
        if (((bVar6 & 1) != 0) &&
           (*(size_type *)
             ((long)&(pTVar17->Output).
                     super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                     ._M_payload.
                     super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                     .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                     _M_payload._M_value.OutputJUnitFile + 8) != 0)) {
          RVar8 = CTEST_JUNIT_UNSUPPORTED;
          goto LAB_001ef10b;
        }
      }
      bVar5 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_ec8,(value_type *)local_ee8);
    }
    PresetPair<cmCMakePresetsGraph::TestPreset>::~PresetPair
              ((PresetPair<cmCMakePresetsGraph::TestPreset> *)&presetPair_1);
    pTVar17 = pTVar17 + 1;
    pbVar12 = local_ed0;
  } while (bVar5);
  goto LAB_001ef371;
  while( true ) {
    (pTVar13->super_Preset).OriginFile = (File *)(pbVar12->_M_dataplus)._M_p;
    if ((pTVar13->super_Preset).Name._M_string_length == 0) goto LAB_001ef36e;
    PresetPair<cmCMakePresetsGraph::PackagePreset>::PresetPair
              ((PresetPair<cmCMakePresetsGraph::PackagePreset> *)&presetPair_1);
    PackagePreset::operator=((PackagePreset *)&presetPair_1,(PackagePreset *)pTVar13);
    psVar1 = &(pTVar13->super_Preset).Name;
    std::_Optional_payload_base<cmCMakePresetsGraph::PackagePreset>::_M_reset
              ((_Optional_payload_base<cmCMakePresetsGraph::PackagePreset> *)
               ((long)&presetPair_1.Expanded.
                       super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>.
                       _M_payload.
                       super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>
                       .super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload +
               0xa0));
    pVar21 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
             ::
             _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
                         *)local_ee0,psVar1,
                        (PresetPair<cmCMakePresetsGraph::PackagePreset> *)&presetPair_1);
    local_ee8 = (BuildPreset *)CONCAT71(local_ee8._1_7_,pVar21.second);
    RVar7 = DUPLICATE_PRESETS;
    if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_ec8,psVar1);
      RVar7 = RVar8;
    }
    RVar8 = RVar7;
    PresetPair<cmCMakePresetsGraph::PackagePreset>::~PresetPair
              ((PresetPair<cmCMakePresetsGraph::PackagePreset> *)&presetPair_1);
    pTVar13 = (TestPreset *)
              ((long)&(pTVar13->Filter).
                      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                      ._M_payload.
                      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>.
                      _M_payload._M_value.Include + 0x48);
    pbVar12 = local_ed0;
    if (((ulong)local_ee8 & 1) == 0) break;
LAB_001ef1ec:
    if (pTVar13 == local_ed8) {
      local_ed8 = (TestPreset *)
                  presets.WorkflowPresets.
                  super__Vector_base<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_ee0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                   *)&this->WorkflowPresets;
      local_ec8 = &this->WorkflowPresetOrder;
      pTVar13 = (TestPreset *)
                presets.WorkflowPresets.
                super__Vector_base<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                ._M_impl.super__Vector_impl_data._M_start;
      RVar7 = RVar8;
      goto LAB_001ef2c6;
    }
  }
  goto LAB_001ef371;
  while( true ) {
    (pTVar13->super_Preset).OriginFile = (File *)(pbVar12->_M_dataplus)._M_p;
    if ((pTVar13->super_Preset).Name._M_string_length == 0) goto LAB_001ef36e;
    PresetPair<cmCMakePresetsGraph::WorkflowPreset>::PresetPair
              ((PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)&presetPair_1);
    WorkflowPreset::operator=((WorkflowPreset *)&presetPair_1,(WorkflowPreset *)pTVar13);
    psVar1 = &(pTVar13->super_Preset).Name;
    std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
              ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)
               ((long)&presetPair_1.Unexpanded.ConfigurePreset.field_2 + 8));
    pVar22 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
             ::
             _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
                         *)local_ee0,psVar1,
                        (PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)&presetPair_1);
    local_ee8 = (BuildPreset *)CONCAT71(local_ee8._1_7_,pVar22.second);
    RVar8 = DUPLICATE_PRESETS;
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_ec8,psVar1);
      RVar8 = RVar7;
    }
    PresetPair<cmCMakePresetsGraph::WorkflowPreset>::~PresetPair
              ((PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)&presetPair_1);
    pTVar13 = (TestPreset *)((pTVar13->ConfigurePreset).field_2._M_local_buf + 8);
    pbVar12 = local_ed0;
    RVar7 = RVar8;
    if (((ulong)local_ee8 & 1) == 0) break;
LAB_001ef2c6:
    if (pTVar13 == local_ed8) {
      includeFile.file = (File *)(pbVar12->_M_dataplus)._M_p;
      local_ed0 = presets.Include.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar12 = presets.Include.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      includeFile.this = this;
      includeFile.inProgressFiles = inProgressFiles;
      goto LAB_001ef3c0;
    }
  }
  goto LAB_001ef371;
LAB_001ef36e:
  RVar8 = INVALID_PRESET;
  goto LAB_001ef371;
  while( true ) {
    std::__cxx11::string::string((string *)&include,(string *)pbVar12);
    bVar5 = cmsys::SystemTools::FileIsFullPath(&include);
    if (!bVar5) {
      cmsys::SystemTools::GetFilenamePath(&directory,filename);
      presetPair_1.Unexpanded.super_Preset._vptr_Preset = (_func_int **)directory._M_string_length;
      presetPair_1.Unexpanded.super_Preset.Name._M_dataplus = directory._M_dataplus;
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)&extraFields.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      extraFields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(extraFields.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0x2f);
      cmStrCat<std::__cxx11::string>
                (&local_d78,(cmAlphaNum *)&presetPair_1,(cmAlphaNum *)&extraFields,&include);
      std::__cxx11::string::operator=((string *)&include,(string *)&local_d78);
      std::__cxx11::string::~string((string *)&local_d78);
      std::__cxx11::string::~string((string *)&directory);
    }
    RVar8 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                      (&includeFile,&include,local_ebc,Included,errMsg);
    std::__cxx11::string::~string((string *)&include);
    pbVar12 = pbVar12 + 1;
    if (RVar8 != READ_OK) break;
LAB_001ef3c0:
    if (pbVar12 == local_ed0) {
      if (local_ebc == User && readReason == Root) {
        GetFilename((string *)&presetPair_1,&this->SourceDir);
        bVar5 = cmsys::SystemTools::FileExists((string *)&presetPair_1);
        if ((bVar5) &&
           (RVar8 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                              (&includeFile,(string *)&presetPair_1,Project,Root,errMsg),
           RVar8 != READ_OK)) {
          bVar5 = false;
        }
        else {
          bVar5 = true;
          RVar8 = RVar7;
        }
        std::__cxx11::string::~string((string *)&presetPair_1);
        if (!bVar5) break;
      }
      pppFVar2 = &(inProgressFiles->
                  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + -1;
      RVar8 = READ_OK;
      break;
    }
  }
LAB_001ef371:
  std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>::
  ~unique_ptr(&filePtr);
LAB_001ef37b:
  anon_unknown.dwarf_4ca4bc::RootPresets::~RootPresets(&presets);
LAB_001eeaa8:
  Json::CharReaderBuilder::~CharReaderBuilder(&builder);
  Json::Value::~Value(&root);
LAB_001eeabf:
  std::ifstream::~ifstream(&fin);
  return RVar8;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadJSONFile(
  const std::string& filename, RootType rootType, ReadReason readReason,
  std::vector<File*>& inProgressFiles, File*& file, std::string& errMsg)
{
  ReadFileResult result;

  for (auto const& f : this->Files) {
    if (cmSystemTools::SameFile(filename, f->Filename)) {
      file = f.get();
      auto fileIt =
        std::find(inProgressFiles.begin(), inProgressFiles.end(), file);
      if (fileIt != inProgressFiles.end()) {
        return cmCMakePresetsGraph::ReadFileResult::CYCLIC_INCLUDE;
      }

      return cmCMakePresetsGraph::ReadFileResult::READ_OK;
    }
  }

  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    errMsg = cmStrCat(filename, ": Failed to read file\n", errMsg);
    return ReadFileResult::FILE_NOT_FOUND;
  }
  // If there's a BOM, toss it.
  cmsys::FStream::ReadBOM(fin);

  Json::Value root;
  Json::CharReaderBuilder builder;
  Json::CharReaderBuilder::strictMode(&builder.settings_);
  if (!Json::parseFromStream(builder, fin, &root, &errMsg)) {
    errMsg = cmStrCat(filename, ":\n", errMsg);
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  int v = 0;
  if ((result = RootVersionHelper(v, &root)) != ReadFileResult::READ_OK) {
    return result;
  }
  if (v < MIN_VERSION || v > MAX_VERSION) {
    return ReadFileResult::UNRECOGNIZED_VERSION;
  }

  // Support for build and test presets added in version 2.
  if (v < 2 &&
      (root.isMember("buildPresets") || root.isMember("testPresets"))) {
    return ReadFileResult::BUILD_TEST_PRESETS_UNSUPPORTED;
  }

  // Support for package presets added in version 6.
  if (v < 6 && root.isMember("packagePresets")) {
    return ReadFileResult::PACKAGE_PRESETS_UNSUPPORTED;
  }

  // Support for workflow presets added in version 6.
  if (v < 6 && root.isMember("workflowPresets")) {
    return ReadFileResult::WORKFLOW_PRESETS_UNSUPPORTED;
  }

  // Support for include added in version 4.
  if (v < 4 && root.isMember("include")) {
    return ReadFileResult::INCLUDE_UNSUPPORTED;
  }

  RootPresets presets;
  if ((result = RootPresetsHelper(presets, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }

  unsigned int currentMajor = cmVersion::GetMajorVersion();
  unsigned int currentMinor = cmVersion::GetMinorVersion();
  unsigned int currentPatch = cmVersion::GetPatchVersion();
  auto const& required = presets.CMakeMinimumRequired;
  if (required.Major > currentMajor ||
      (required.Major == currentMajor &&
       (required.Minor > currentMinor ||
        (required.Minor == currentMinor &&
         (required.Patch > currentPatch))))) {
    return ReadFileResult::UNRECOGNIZED_CMAKE_VERSION;
  }

  auto filePtr = cm::make_unique<File>();
  file = filePtr.get();
  this->Files.emplace_back(std::move(filePtr));
  inProgressFiles.emplace_back(file);
  file->Filename = filename;
  file->Version = v;
  file->ReachableFiles.insert(file);

  for (auto& preset : presets.ConfigurePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<ConfigurePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->ConfigurePresets
           .emplace(std::make_pair(preset.Name, presetPair))
           .second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for installDir presets added in version 3.
    if (v < 3 && !preset.InstallDir.empty()) {
      return ReadFileResult::INSTALL_PREFIX_UNSUPPORTED;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for toolchainFile presets added in version 3.
    if (v < 3 && !preset.ToolchainFile.empty()) {
      return ReadFileResult::TOOLCHAIN_FILE_UNSUPPORTED;
    }

    this->ConfigurePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.BuildPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<BuildPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->BuildPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    this->BuildPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.TestPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<TestPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->TestPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for TestOutputTruncation added in version 5.
    if (v < 5 && preset.Output && preset.Output->TestOutputTruncation) {
      return ReadFileResult::TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
    }

    // Support for outputJUnitFile added in version 6.
    if (v < 6 && preset.Output && !preset.Output->OutputJUnitFile.empty()) {
      return ReadFileResult::CTEST_JUNIT_UNSUPPORTED;
    }

    this->TestPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.PackagePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<PackagePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->PackagePresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 5
    // already, so no action needed.

    this->PackagePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.WorkflowPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<WorkflowPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->WorkflowPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 6
    // already, so no action needed.

    this->WorkflowPresetOrder.push_back(preset.Name);
  }

  auto const includeFile = [this, &inProgressFiles, file](
                             const std::string& include, RootType rootType2,
                             ReadReason readReason2,
                             std::string& FailureMessage) -> ReadFileResult {
    ReadFileResult r;
    File* includedFile;
    if ((r = this->ReadJSONFile(include, rootType2, readReason2,
                                inProgressFiles, includedFile,
                                FailureMessage)) != ReadFileResult::READ_OK) {
      return r;
    }

    file->ReachableFiles.insert(includedFile->ReachableFiles.begin(),
                                includedFile->ReachableFiles.end());
    return ReadFileResult::READ_OK;
  };

  for (auto include : presets.Include) {
    if (!cmSystemTools::FileIsFullPath(include)) {
      auto directory = cmSystemTools::GetFilenamePath(filename);
      include = cmStrCat(directory, '/', include);
    }

    if ((result = includeFile(include, rootType, ReadReason::Included,
                              errMsg)) != ReadFileResult::READ_OK) {
      return result;
    }
  }

  if (rootType == RootType::User && readReason == ReadReason::Root) {
    auto cmakePresetsFilename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(cmakePresetsFilename)) {
      if ((result = includeFile(cmakePresetsFilename, RootType::Project,
                                ReadReason::Root, errMsg)) !=
          ReadFileResult::READ_OK) {
        return result;
      }
    }
  }

  inProgressFiles.pop_back();
  return ReadFileResult::READ_OK;
}